

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GrowableArray.h
# Opt level: O0

void Corrade::Containers::ArrayMallocAllocator<bool>::reallocate
               (bool **array,size_t param_2,size_t newCapacity)

{
  ostream *output;
  Debug *pDVar1;
  Flags local_59;
  Error local_58;
  undefined8 *local_30;
  char *memory;
  size_t inBytes;
  size_t newCapacity_local;
  size_t param_1_local;
  bool **array_local;
  
  memory = (char *)(newCapacity + 8);
  inBytes = newCapacity;
  newCapacity_local = param_2;
  param_1_local = (size_t)array;
  local_30 = (undefined8 *)realloc(*array + -8,(size_t)memory);
  if (local_30 == (undefined8 *)0x0) {
    output = Utility::Error::defaultOutput();
    EnumSet<Corrade::Utility::Debug::Flag,_(unsigned_char)'\xff'>::EnumSet(&local_59);
    Utility::Error::Error(&local_58,output,local_59);
    pDVar1 = Utility::Debug::operator<<
                       (&local_58.super_Debug,"Containers::ArrayMallocAllocator: can\'t reallocate")
    ;
    pDVar1 = Utility::Debug::operator<<(pDVar1,(unsigned_long)memory);
    Utility::Debug::operator<<(pDVar1,"bytes");
    Utility::Error::~Error(&local_58);
    abort();
  }
  *local_30 = memory;
  *(undefined8 **)param_1_local = local_30 + 1;
  return;
}

Assistant:

void ArrayMallocAllocator<T>::reallocate(T*& array, std::size_t, const std::size_t newCapacity) {
    const std::size_t inBytes = newCapacity*sizeof(T) + AllocationOffset;
    char* const memory = static_cast<char*>(std::realloc(reinterpret_cast<char*>(array) - AllocationOffset, inBytes));
    CORRADE_ASSERT(memory,
        "Containers::ArrayMallocAllocator: can't reallocate" << inBytes << "bytes", );
    reinterpret_cast<std::size_t*>(memory)[0] = inBytes;
    array = reinterpret_cast<T*>(memory + AllocationOffset);
}